

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btMultiBodyConstraint_*>::resize
          (btAlignedObjectArray<btMultiBodyConstraint_*> *this,int newsize,
          btMultiBodyConstraint **fillData)

{
  int iVar1;
  undefined8 *in_RDX;
  int in_ESI;
  btAlignedObjectArray<btMultiBodyConstraint_*> *in_RDI;
  int i_1;
  int i;
  int curSize;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar1 = size(in_RDI);
  iVar2 = in_ESI;
  if (in_ESI < iVar1) {
    for (; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    }
  }
  else {
    if (iVar1 < in_ESI) {
      reserve((btAlignedObjectArray<btMultiBodyConstraint_*> *)
              CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    }
    for (; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      in_RDI->m_data[iVar1] = (btMultiBodyConstraint *)*in_RDX;
    }
  }
  in_RDI->m_size = in_ESI;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}